

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_AllocateSideDefs(int count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  size_t __n;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)count;
  __n = SUB168(auVar1 * ZEXT816(0xd8),0);
  sVar5 = __n;
  if (SUB168(auVar1 * ZEXT816(0xd8),8) != 0) {
    sVar5 = 0xffffffffffffffff;
  }
  sides = (side_t *)operator_new__(sVar5);
  lVar6 = 0;
  memset(sides,0,__n);
  iVar3 = numvertexes;
  if (numvertexes < count) {
    iVar3 = count;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar3;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
    uVar4 = SUB168(auVar2 * ZEXT816(0xc),0);
  }
  sidetemp = (sidei_t *)operator_new__(uVar4);
  uVar4 = 0;
  if (0 < count) {
    uVar4 = (ulong)(uint)count;
  }
  for (; uVar4 * 0xc - lVar6 != 0; lVar6 = lVar6 + 0xc) {
    *(undefined2 *)((long)&sidetemp->field_0 + lVar6) = 0;
    *(undefined2 *)((long)&sidetemp->field_0 + lVar6 + 2) = 0;
    *(undefined2 *)((long)&sidetemp->field_0 + lVar6 + 4) = 0x8000;
    *(undefined4 *)((long)&sidetemp->field_0 + lVar6 + 8) = 0xffffffff;
  }
  if (count < numsides) {
    Printf("Map has %d unused sidedefs\n");
  }
  numsides = count;
  sidecount = 0;
  return;
}

Assistant:

static void P_AllocateSideDefs (int count)
{
	int i;

	sides = new side_t[count];
	memset (sides, 0, count*sizeof(side_t));

	sidetemp = new sidei_t[MAX(count,numvertexes)];
	for (i = 0; i < count; i++)
	{
		sidetemp[i].a.special = sidetemp[i].a.tag = 0;
		sidetemp[i].a.alpha = SHRT_MIN;
		sidetemp[i].a.map = NO_SIDE;
	}
	if (count < numsides)
	{
		Printf ("Map has %d unused sidedefs\n", numsides - count);
	}
	numsides = count;
	sidecount = 0;
}